

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Cnf_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int r_00;
  undefined4 local_34;
  int step;
  int i;
  int *pnVars_local;
  int r_local;
  int hi_local;
  int lo_local;
  int *pVars_local;
  sat_solver *p_local;
  
  r_00 = r * 2;
  if (r_00 < hi - lo) {
    Cnf_AddCardinConstrMerge(p,pVars,lo,hi - r,r_00,pnVars);
    Cnf_AddCardinConstrMerge(p,pVars,lo + r,hi,r_00,pnVars);
    for (local_34 = lo + r; local_34 < hi - r; local_34 = r_00 + local_34) {
      Cnf_AddSorder(p,pVars,local_34,local_34 + r,pnVars);
    }
  }
  return;
}

Assistant:

static inline void Cnf_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Cnf_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Cnf_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Cnf_AddSorder( p, pVars, i, i+r, pnVars );
    }
}